

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

SeatPromptResult *
filexfer_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Seat *seat,prompts_t *p)

{
  SeatPromptResult *spr;
  _func_void_SeatPromptResult_BinarySink_ptr *local_50;
  char *local_48;
  uint local_40;
  undefined4 uStack_3c;
  SeatPromptResult local_38;
  prompts_t *local_18;
  prompts_t *p_local;
  Seat *seat_local;
  
  local_18 = p;
  p_local = (prompts_t *)seat;
  cmdline_get_passwd_input(&local_38,p,&filexfer_get_userpass_input::cmdline_state,false);
  __return_storage_ptr__->kind = local_38.kind;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_38._4_4_;
  __return_storage_ptr__->errfn = local_38.errfn;
  __return_storage_ptr__->errdata_lit = local_38.errdata_lit;
  __return_storage_ptr__->errdata_u = local_38.errdata_u;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_38._28_4_;
  if (__return_storage_ptr__->kind == SPRK_INCOMPLETE) {
    console_get_userpass_input((SeatPromptResult *)&spr,local_18);
    *(SeatPromptResult **)__return_storage_ptr__ = spr;
    __return_storage_ptr__->errfn = local_50;
    __return_storage_ptr__->errdata_lit = local_48;
    __return_storage_ptr__->errdata_u = local_40;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uStack_3c;
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult filexfer_get_userpass_input(Seat *seat, prompts_t *p)
{
    /* The file transfer tools don't support Restart Session, so we
     * can just have a single static cmdline_get_passwd_input_state
     * that's never reset */
    static cmdline_get_passwd_input_state cmdline_state =
        CMDLINE_GET_PASSWD_INPUT_STATE_INIT;

    SeatPromptResult spr;
    spr = cmdline_get_passwd_input(p, &cmdline_state, false);
    if (spr.kind == SPRK_INCOMPLETE)
        spr = console_get_userpass_input(p);
    return spr;
}